

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenKeyCompare
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  code = code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  if ((struct_def->has_key & 1U) == 0) {
    __assert_fail("struct_def.has_key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x3a6,
                  "void flatbuffers::go::GoGenerator::GenKeyCompare(const StructDef &, const FieldDef &, std::string *)"
                 );
  }
  if ((field->key & 1U) != 0) {
    local_30 = code_ptr;
    IdlNamer::Type_abi_cxx11_(&local_90,&this->namer_,struct_def);
    std::operator+(&local_70,"func ",&local_90);
    std::operator+(&local_50,&local_70,"KeyCompare(");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::operator+=
              ((string *)local_30,"o1, o2 flatbuffers.UOffsetT, buf []byte) bool {\n");
    IdlNamer::Type_abi_cxx11_(&local_100,&this->namer_,(StructDef *)field_local);
    std::operator+(&local_e0,"\tobj1 := &",&local_100);
    std::operator+(&local_c0,&local_e0,"{}\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    IdlNamer::Type_abi_cxx11_(&local_160,&this->namer_,(StructDef *)field_local);
    std::operator+(&local_140,"\tobj2 := &",&local_160);
    std::operator+(&local_120,&local_140,"{}\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::operator+=
              ((string *)local_30,"\tobj1.Init(buf, flatbuffers.UOffsetT(len(buf))-o1)\n");
    std::__cxx11::string::operator+=
              ((string *)local_30,"\tobj2.Init(buf, flatbuffers.UOffsetT(len(buf))-o2)\n");
    bVar1 = IsString((Type *)&code_ptr_local[6]._M_string_length);
    if (bVar1) {
      Namer::Function(&local_1c0,&(this->namer_).super_Namer,code_ptr_local);
      std::operator+(&local_1a0,"\treturn string(obj1.",&local_1c0);
      std::operator+(&local_180,&local_1a0,"()) < ");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      Namer::Function(&local_220,&(this->namer_).super_Namer,code_ptr_local);
      std::operator+(&local_200,"string(obj2.",&local_220);
      std::operator+(&local_1e0,&local_200,"())\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
    }
    else {
      Namer::Function(&local_280,&(this->namer_).super_Namer,code_ptr_local);
      std::operator+(&local_260,"\treturn obj1.",&local_280);
      std::operator+(&local_240,&local_260,"() < ");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      Namer::Function(&local_2e0,&(this->namer_).super_Namer,code_ptr_local);
      std::operator+(&local_2c0,"obj2.",&local_2e0);
      std::operator+(&local_2a0,&local_2c0,"()\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
    return;
  }
  __assert_fail("field.key",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                ,0x3a7,
                "void flatbuffers::go::GoGenerator::GenKeyCompare(const StructDef &, const FieldDef &, std::string *)"
               );
}

Assistant:

void GenKeyCompare(const StructDef &struct_def, const FieldDef &field,
                     std::string *code_ptr) {
    FLATBUFFERS_ASSERT(struct_def.has_key);
    FLATBUFFERS_ASSERT(field.key);
    std::string &code = *code_ptr;

    code += "func " + namer_.Type(struct_def) + "KeyCompare(";
    code += "o1, o2 flatbuffers.UOffsetT, buf []byte) bool {\n";
    code += "\tobj1 := &" + namer_.Type(struct_def) + "{}\n";
    code += "\tobj2 := &" + namer_.Type(struct_def) + "{}\n";
    code += "\tobj1.Init(buf, flatbuffers.UOffsetT(len(buf))-o1)\n";
    code += "\tobj2.Init(buf, flatbuffers.UOffsetT(len(buf))-o2)\n";
    if (IsString(field.value.type)) {
      code += "\treturn string(obj1." + namer_.Function(field.name) + "()) < ";
      code += "string(obj2." + namer_.Function(field.name) + "())\n";
    } else {
      code += "\treturn obj1." + namer_.Function(field.name) + "() < ";
      code += "obj2." + namer_.Function(field.name) + "()\n";
    }
    code += "}\n\n";
  }